

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void place_vibrating_square(level *lev)

{
  xchar x_00;
  boolean bVar1;
  int x_01;
  int x_02;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int y;
  int x;
  int y_range;
  int x_range;
  int INVPOS_DISTANCE;
  int INVPOS_Y_MARGIN;
  int INVPOS_X_MARGIN;
  int y_maze_min;
  int x_maze_min;
  level *lev_local;
  xchar y_00;
  
  x_01 = x_maze_max + -0xb;
  x_02 = y_maze_max + -9;
  inv_pos.y = '\0';
  inv_pos.x = '\0';
  do {
    iVar2 = rn2(x_01);
    iVar2 = iVar2 + 7;
    iVar3 = rn2(x_02);
    iVar3 = iVar3 + 6;
    bVar6 = true;
    x_00 = (xchar)iVar2;
    y_00 = (xchar)iVar3;
    if ((iVar2 != (lev->upstair).sx) && (bVar6 = true, iVar3 != (lev->upstair).sy)) {
      iVar4 = iVar2 - (lev->upstair).sx;
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      iVar5 = iVar3 - (lev->upstair).sy;
      if (iVar5 < 1) {
        iVar5 = -iVar5;
      }
      bVar6 = true;
      if (iVar4 != iVar5) {
        iVar4 = distmin(iVar2,iVar3,(int)(lev->upstair).sx,(int)(lev->upstair).sy);
        bVar6 = true;
        if ((0xb < iVar4) && (bVar6 = true, '\x17' < lev->locations[iVar2][iVar3].typ)) {
          bVar1 = occupied(lev,x_00,y_00);
          bVar6 = bVar1 != '\0';
        }
      }
    }
  } while (bVar6);
  inv_pos.x = x_00;
  inv_pos.y = y_00;
  maketrap(lev,(int)x_00,(int)y_00,0xf);
  if (urole.malenum == 0x159) {
    make_engr_at(lev,(int)inv_pos.x,(int)inv_pos.y,"X",0,'\x01');
  }
  return;
}

Assistant:

static void place_vibrating_square(struct level *lev)
{
	/*
	 * Pick a position where the stairs down to Moloch's Sanctum
	 * level will ultimately be created.  At that time, an area
	 * will be altered:  walls removed, moat and traps generated,
	 * boulders destroyed.  The position picked here must ensure
	 * that that invocation area won't extend off the map.
	 *
	 * We actually allow up to 2 squares around the usual edge of
	 * the area to get truncated; see mkinvokearea(mklev.c).
	 */
	const int x_maze_min = 2;
	const int y_maze_min = 2;
	const int INVPOS_X_MARGIN = 6 - 2;
	const int INVPOS_Y_MARGIN = 5 - 2;
	const int INVPOS_DISTANCE = 11;

	int x_range = x_maze_max - x_maze_min - 2*INVPOS_X_MARGIN - 1,
	    y_range = y_maze_max - y_maze_min - 2*INVPOS_Y_MARGIN - 1;
	int x, y;

	inv_pos.x = inv_pos.y = 0; /*{occupied() => invocation_pos()}*/
	do {
	    x = rn1(x_range, x_maze_min + INVPOS_X_MARGIN + 1);
	    y = rn1(y_range, y_maze_min + INVPOS_Y_MARGIN + 1);
	    /* we don't want it to be too near the stairs, nor
	       to be on a spot that's already in use (wall|trap) */
	} while (x == lev->upstair.sx || y == lev->upstair.sy ||	/*(direct line)*/
		 abs(x - lev->upstair.sx) == abs(y - lev->upstair.sy) ||
		 distmin(x, y, lev->upstair.sx, lev->upstair.sy) <= INVPOS_DISTANCE ||
		 !SPACE_POS(lev->locations[x][y].typ) || occupied(lev, x, y));
	inv_pos.x = x;
	inv_pos.y = y;
	maketrap(lev, inv_pos.x, inv_pos.y, VIBRATING_SQUARE);

	/* "'X' never, ever marks the spot." */
	if (Role_if(PM_ARCHEOLOGIST))
	    make_engr_at(lev, inv_pos.x, inv_pos.y, "X", 0L, DUST);
}